

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_2::ValidateAccessChain(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  ushort uVar2;
  uint32_t id;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int32_t iVar6;
  char *pcVar7;
  long *plVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  DiagnosticStream *pDVar11;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  size_t index;
  pointer puVar15;
  ulong uVar16;
  spv_result_t sVar17;
  string instr_name;
  int64_t cur_index;
  long *local_260;
  long local_250;
  long lStack_248;
  Instruction *local_240;
  char *local_238;
  string local_230;
  Instruction *local_210;
  undefined1 *local_208 [2];
  long local_1f8 [56];
  spv_result_t local_38;
  
  pcVar7 = spvOpcodeString((uint)(inst->inst_).opcode);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,pcVar7,(allocator<char> *)&local_230);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x360e57);
  local_260 = &local_250;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_250 = *plVar12;
    lStack_248 = plVar8[3];
  }
  else {
    local_250 = *plVar12;
    local_260 = (long *)*plVar8;
  }
  lVar14 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_208[0] != &((DiagnosticStream *)local_208)->field_0x10) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  bVar3 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
  pIVar9 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
  if (bVar3) {
    if ((pIVar9 == (Instruction *)0x0) || ((pIVar9->inst_).opcode != 0x1141)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_260,lVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_(&local_230,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," must be OpTypeUntypedPointerKHR. Found Op",0x2a);
      local_238 = spvOpcodeString((uint)(pIVar9->inst_).opcode);
      pDVar11 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar11,".",1);
      sVar17 = pDVar11->error_;
LAB_002f0061:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
LAB_002f0082:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      goto LAB_002f042c;
    }
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar10 = ValidationState_t::FindDef(_,uVar5);
    if ((((pIVar10 != (Instruction *)0x0) &&
         (iVar6 = spvOpcodeGeneratesType((uint)(pIVar10->inst_).opcode), iVar6 != 0)) &&
        (uVar1 = (pIVar10->inst_).opcode, uVar1 != 0x1141)) && (index = 3, uVar1 != 0x20))
    goto LAB_002efd57;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar7 = "Base type must be a non-pointer type";
    lVar14 = 0x24;
LAB_002f0410:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar7,lVar14);
    sVar17 = local_38;
  }
  else {
    if ((pIVar9 != (Instruction *)0x0) && (index = 2, (pIVar9->inst_).opcode == 0x20)) {
LAB_002efd57:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,index);
      pIVar10 = ValidationState_t::FindDef(_,uVar5);
      pIVar10 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
      if (pIVar10 == (Instruction *)0x0) {
LAB_002effcf:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"The Base <id> ",0xe);
        ValidationState_t::getIdName_abi_cxx11_(&local_230,_,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," in ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_260,lVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," instruction must be a pointer.",0x1f);
        sVar17 = local_38;
        goto LAB_002f0061;
      }
      uVar1 = (pIVar10->inst_).opcode;
      if (uVar1 == 0x20) {
        puVar15 = (pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2] == puVar15[2]) {
          if (bVar3) {
LAB_002eff7f:
            uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          }
          else {
            uVar5 = puVar15[3];
          }
          pIVar10 = ValidationState_t::FindDef(_,uVar5);
          puVar15 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar15 >> 2;
          uVar2 = (inst->inst_).opcode;
          if (uVar2 - 0x1147 < 2) {
LAB_002effc6:
            uVar16 = uVar13 - 5;
LAB_002f00fc:
            if (uVar16 <= (_->options_->universal_limits_).max_access_chain_indexes) {
              uVar5 = bVar3 | 4;
              if ((uVar2 - 0x1147 < 2) || (uVar2 == 0x46)) {
LAB_002f01ab:
                uVar5 = uVar5 + 1;
              }
              uVar16 = (ulong)uVar5;
              local_240 = pIVar10;
              if (uVar16 < uVar13) {
                do {
                  id = puVar15[uVar16];
                  local_210 = ValidationState_t::FindDef(_,id);
                  pIVar10 = ValidationState_t::FindDef(_,(local_210->inst_).type_id);
                  if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x15)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"Indexes passed to ",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_260,lVar14);
                    pcVar7 = " must be of type integer.";
                    lVar14 = 0x19;
                    goto LAB_002f0410;
                  }
                  uVar2 = (local_240->inst_).opcode;
                  if (uVar2 < 0x1f) {
                    if ((0x31800000U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_002f020d;
                    if (uVar2 != 0x1e) goto LAB_002f028c;
                    bVar4 = ValidationState_t::EvalConstantValInt64(_,id,(int64_t *)&local_238);
                    pIVar10 = local_240;
                    if (!bVar4) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,local_210);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,"The <id> passed to ",0x13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,(char *)local_260,lVar14);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,
                                 " to index into a structure must be an OpConstant.",0x31);
                      sVar17 = local_38;
                      goto LAB_002f0422;
                    }
                    puVar15 = (local_240->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    if (((long)local_238 < 0) ||
                       (((long)(local_240->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar15 >> 2) + -2
                        <= (long)local_238)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,local_210);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,"Index is out of bounds: ",0x18);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,(char *)local_260,lVar14);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208," cannot find index ",0x13);
                      std::ostream::_M_insert<long>((long)local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208," into the structure <id> ",0x19);
                      ValidationState_t::getIdName_abi_cxx11_
                                (&local_230,_,(pIVar10->inst_).result_id);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_230._M_dataplus._M_p,
                                 local_230._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,". This structure has ",0x15);
                      std::ostream::_M_insert<long>((long)local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208," members. Largest valid index is ",0x21);
                      std::ostream::_M_insert<long>((long)local_208);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1)
                      ;
                      sVar17 = local_38;
                      goto LAB_002f0061;
                    }
                    uVar5 = puVar15[(long)(local_238 + 2)];
                  }
                  else {
LAB_002f028c:
                    if ((uVar2 != 0x14ee) && (uVar2 != 0x1168)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,(char *)local_260,lVar14);
                      pcVar7 = 
                      " reached non-composite type while indexes still remain to be traversed.";
                      lVar14 = 0x47;
                      goto LAB_002f0410;
                    }
LAB_002f020d:
                    uVar5 = (local_240->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[2];
                  }
                  local_240 = ValidationState_t::FindDef(_,uVar5);
                  uVar16 = uVar16 + 1;
                  puVar15 = (inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                } while (uVar16 < (ulong)((long)(inst->words_).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)puVar15 >> 2));
              }
              sVar17 = SPV_SUCCESS;
              if ((bVar3) ||
                 (pIVar10 = ValidationState_t::FindDef
                                      (_,(pIVar9->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[3]),
                 pIVar9 = local_240, (local_240->inst_).result_id == (pIVar10->inst_).result_id))
              goto LAB_002f042c;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,(char *)local_260,lVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," result type (Op",0x10);
              local_230._M_dataplus._M_p = spvOpcodeString((uint)(pIVar10->inst_).opcode);
              pDVar11 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_208,(char **)&local_230);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar11,
                         ") does not match the type that results from indexing into the base <id> (Op"
                         ,0x4b);
              local_238 = spvOpcodeString((uint)(pIVar9->inst_).opcode);
              pDVar11 = DiagnosticStream::operator<<(pDVar11,&local_238);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar11,").",2);
              sVar17 = pDVar11->error_;
              goto LAB_002f0082;
            }
          }
          else {
            if (uVar2 != 0x43) {
              if (uVar2 == 0x46) goto LAB_002effc6;
              uVar16 = uVar13 - 4;
              goto LAB_002f00fc;
            }
            if (uVar13 - 5 <= (ulong)(_->options_->universal_limits_).max_access_chain_indexes) {
              uVar5 = bVar3 | 4;
              goto LAB_002f01ab;
            }
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"The number of indexes in ",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_260,lVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," may not exceed ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,". Found ",8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          pcVar7 = " indexes.";
          lVar14 = 9;
          goto LAB_002f0410;
        }
      }
      else {
        if (!bVar3 || uVar1 != 0x1141) goto LAB_002effcf;
        if ((pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2] ==
            (pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[2]) goto LAB_002eff7f;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "The result pointer storage class and base pointer storage class in ",0x43);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_260,lVar14);
      pcVar7 = " do not match.";
      lVar14 = 0xe;
      goto LAB_002f0410;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"The Result Type of ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_260,lVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
    ValidationState_t::getIdName_abi_cxx11_(&local_230,_,(inst->inst_).result_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208," must be OpTypePointer. Found Op",0x20);
    local_238 = spvOpcodeString((uint)(pIVar9->inst_).opcode);
    pDVar11 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar11,".",1);
    sVar17 = pDVar11->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002f0422:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_002f042c:
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  return sVar17;
}

Assistant:

spv_result_t ValidateAccessChain(ValidationState_t& _,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  const bool untyped_pointer = spvOpcodeGeneratesUntypedPointer(inst->opcode());

  // The result type must be OpTypePointer for regular access chains and an
  // OpTypeUntypedPointerKHR for untyped access chains.
  auto result_type = _.FindDef(inst->type_id());
  if (untyped_pointer) {
    if (!result_type ||
        spv::Op::OpTypeUntypedPointerKHR != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id())
             << " must be OpTypeUntypedPointerKHR. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  } else {
    if (!result_type || spv::Op::OpTypePointer != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  }

  if (untyped_pointer) {
    // Base type must be a non-pointer type.
    const auto base_type = _.FindDef(inst->GetOperandAs<uint32_t>(2));
    if (!base_type || !spvOpcodeGeneratesType(base_type->opcode()) ||
        base_type->opcode() == spv::Op::OpTypePointer ||
        base_type->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Base type must be a non-pointer type";
    }
  }

  // Base must be a pointer, pointing to the base of a composite object.
  const auto base_index = untyped_pointer ? 3 : 2;
  const auto base_id = inst->GetOperandAs<uint32_t>(base_index);
  const auto base = _.FindDef(base_id);
  const auto base_type = _.FindDef(base->type_id());
  if (!base_type || !(spv::Op::OpTypePointer == base_type->opcode() ||
                      (untyped_pointer && spv::Op::OpTypeUntypedPointerKHR ==
                                              base_type->opcode()))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Base <id> " << _.getIdName(base_id) << " in " << instr_name
           << " instruction must be a pointer.";
  }

  // The result pointer storage class and base pointer storage class must match.
  // Word 2 of OpTypePointer is the Storage Class.
  auto result_type_storage_class = result_type->word(2);
  auto base_type_storage_class = base_type->word(2);
  if (result_type_storage_class != base_type_storage_class) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The result pointer storage class and base "
              "pointer storage class in "
           << instr_name << " do not match.";
  }

  // The type pointed to by OpTypePointer (word 3) must be a composite type.
  auto type_pointee = untyped_pointer
                          ? _.FindDef(inst->GetOperandAs<uint32_t>(2))
                          : _.FindDef(base_type->word(3));

  // Check Universal Limit (SPIR-V Spec. Section 2.17).
  // The number of indexes passed to OpAccessChain may not exceed 255
  // The instruction includes 4 words + N words (for N indexes)
  size_t num_indexes = inst->words().size() - 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    // In pointer access chains, the element operand is required, but not
    // counted as an index.
    --num_indexes;
  }
  const size_t num_indexes_limit =
      _.options()->universal_limits_.max_access_chain_indexes;
  if (num_indexes > num_indexes_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The number of indexes in " << instr_name << " may not exceed "
           << num_indexes_limit << ". Found " << num_indexes << " indexes.";
  }
  // Indexes walk the type hierarchy to the desired depth, potentially down to
  // scalar granularity. The first index in Indexes will select the top-level
  // member/element/component/element of the base composite. All composite
  // constituents use zero-based numbering, as described by their OpType...
  // instruction. The second index will apply similarly to that result, and so
  // on. Once any non-composite type is reached, there must be no remaining
  // (unused) indexes.
  auto starting_index = untyped_pointer ? 5 : 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    ++starting_index;
  }
  for (size_t i = starting_index; i < inst->words().size(); ++i) {
    const uint32_t cur_word = inst->words()[i];
    // Earlier ID checks ensure that cur_word definition exists.
    auto cur_word_instr = _.FindDef(cur_word);
    // The index must be a scalar integer type (See OpAccessChain in the Spec.)
    auto index_type = _.FindDef(cur_word_instr->type_id());
    if (!index_type || spv::Op::OpTypeInt != index_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Indexes passed to " << instr_name
             << " must be of type integer.";
    }
    switch (type_pointee->opcode()) {
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray: {
        // In OpTypeMatrix, OpTypeVector, spv::Op::OpTypeCooperativeMatrixNV,
        // OpTypeArray, and OpTypeRuntimeArray, word 2 is the Element Type.
        type_pointee = _.FindDef(type_pointee->word(2));
        break;
      }
      case spv::Op::OpTypeStruct: {
        // In case of structures, there is an additional constraint on the
        // index: the index must be an OpConstant.
        int64_t cur_index;
        if (!_.EvalConstantValInt64(cur_word, &cur_index)) {
          return _.diag(SPV_ERROR_INVALID_ID, cur_word_instr)
                 << "The <id> passed to " << instr_name
                 << " to index into a "
                    "structure must be an OpConstant.";
        }

        // The index points to the struct member we want, therefore, the index
        // should be less than the number of struct members.
        const int64_t num_struct_members =
            static_cast<int64_t>(type_pointee->words().size() - 2);
        if (cur_index >= num_struct_members || cur_index < 0) {
          return _.diag(SPV_ERROR_INVALID_ID, cur_word_instr)
                 << "Index is out of bounds: " << instr_name
                 << " cannot find index " << cur_index
                 << " into the structure <id> "
                 << _.getIdName(type_pointee->id()) << ". This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        // Struct members IDs start at word 2 of OpTypeStruct.
        const size_t word_index = static_cast<size_t>(cur_index) + 2;
        auto structMemberId = type_pointee->word(word_index);
        type_pointee = _.FindDef(structMemberId);
        break;
      }
      default: {
        // Give an error. reached non-composite type while indexes still remain.
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << instr_name
               << " reached non-composite type while indexes "
                  "still remain to be traversed.";
      }
    }
  }

  if (!untyped_pointer) {
    // Result type is a pointer. Find out what it's pointing to.
    // This will be used to make sure the indexing results in the same type.
    // OpTypePointer word 3 is the type being pointed to.
    const auto result_type_pointee = _.FindDef(result_type->word(3));
    // At this point, we have fully walked down from the base using the indeces.
    // The type being pointed to should be the same as the result type.
    if (type_pointee->id() != result_type_pointee->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << instr_name << " result type (Op"
             << spvOpcodeString(
                    static_cast<spv::Op>(result_type_pointee->opcode()))
             << ") does not match the type that results from indexing into the "
                "base "
                "<id> (Op"
             << spvOpcodeString(static_cast<spv::Op>(type_pointee->opcode()))
             << ").";
    }
  }

  return SPV_SUCCESS;
}